

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlnode.cpp
# Opt level: O2

XmlNodePtr __thiscall libcellml::XmlNode::firstChild(XmlNode *this)

{
  XmlNode *this_00;
  size_type sVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  undefined8 *in_RSI;
  xmlNodePtr pxVar2;
  XmlNodePtr XVar3;
  string sStack_48;
  
  pxVar2 = *(xmlNodePtr *)(*(long *)*in_RSI + 0x18);
  this->mPimpl = (XmlNodeImpl *)0x0;
  this[1].mPimpl = (XmlNodeImpl *)0x0;
  if (pxVar2 != (xmlNodePtr)0x0) {
    while( true ) {
      std::make_shared<libcellml::XmlNode>();
      std::__shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2> *)this,
                 (__shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2> *)&sStack_48);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&sStack_48._M_string_length);
      this_00 = (XmlNode *)this->mPimpl;
      this_00->mPimpl->mXmlNodePtr = pxVar2;
      in_RDX._M_pi = extraout_RDX;
      if (pxVar2->type != XML_TEXT_NODE) break;
      convertToStrippedString_abi_cxx11_(&sStack_48,this_00);
      sVar1 = sStack_48._M_string_length;
      std::__cxx11::string::~string((string *)&sStack_48);
      in_RDX._M_pi = extraout_RDX_00;
      if ((sVar1 != 0) || (pxVar2 = pxVar2->next, pxVar2 == (_xmlNode *)0x0)) break;
    }
  }
  XVar3.super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       in_RDX._M_pi;
  XVar3.super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (XmlNodePtr)XVar3.super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

XmlNodePtr XmlNode::firstChild() const
{
    xmlNodePtr child = mPimpl->mXmlNodePtr->children;
    XmlNodePtr childHandle = nullptr;
    while (child != nullptr) {
        childHandle = std::make_shared<XmlNode>();
        childHandle->setXmlNode(child);
        bool textNode = childHandle->isText();
        if (!textNode || !childHandle->convertToStrippedString().empty()) {
            break;
        }
        child = child->next;
    }
    return childHandle;
}